

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

bool gl4cts::ShaderSubroutine::Utils::buildProgram
               (Functions *gl,string *vs_body,string *tc_body,string *te_body,string *gs_body,
               string *fs_body,GLchar **xfb_varyings,uint *n_xfb_varyings,GLuint *out_vs_id,
               GLuint *out_tc_id,GLuint *out_te_id,GLuint *out_gs_id,GLuint *out_fs_id,
               GLuint *out_po_id)

{
  GLuint GVar1;
  GLenum GVar2;
  uint n_so_id;
  long lVar3;
  GLint compile_status;
  GLuint so_ids [5];
  GLint link_status;
  string *local_48;
  string *local_40;
  string *local_38;
  
  link_status = 0;
  local_48 = te_body;
  local_40 = gs_body;
  local_38 = fs_body;
  GVar1 = (*gl->createProgram)();
  *out_po_id = GVar1;
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"glCreateProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x34c);
  if (out_vs_id != (GLuint *)0x0) {
    so_ids._0_8_ = (vs_body->_M_dataplus)._M_p;
    GVar1 = (*gl->createShader)(0x8b31);
    *out_vs_id = GVar1;
    GVar2 = (*gl->getError)();
    glu::checkError(GVar2,"glCreateShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x353);
    (*gl->attachShader)(*out_po_id,*out_vs_id);
    GVar2 = (*gl->getError)();
    glu::checkError(GVar2,"glAttachShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x356);
    (*gl->shaderSource)(*out_vs_id,1,(GLchar **)so_ids,(GLint *)0x0);
    GVar2 = (*gl->getError)();
    glu::checkError(GVar2,"glShaderSource() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x359);
  }
  if (out_tc_id != (GLuint *)0x0) {
    so_ids._0_8_ = (tc_body->_M_dataplus)._M_p;
    GVar1 = (*gl->createShader)(0x8e88);
    *out_tc_id = GVar1;
    GVar2 = (*gl->getError)();
    glu::checkError(GVar2,"glCreateShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x361);
    (*gl->attachShader)(*out_po_id,*out_tc_id);
    GVar2 = (*gl->getError)();
    glu::checkError(GVar2,"glAttachShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x364);
    (*gl->shaderSource)(*out_tc_id,1,(GLchar **)so_ids,(GLint *)0x0);
    GVar2 = (*gl->getError)();
    glu::checkError(GVar2,"glShaderSource() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x367);
  }
  if (out_te_id != (GLuint *)0x0) {
    so_ids._0_8_ = (local_48->_M_dataplus)._M_p;
    GVar1 = (*gl->createShader)(0x8e87);
    *out_te_id = GVar1;
    GVar2 = (*gl->getError)();
    glu::checkError(GVar2,"glCreateShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x36f);
    (*gl->attachShader)(*out_po_id,*out_te_id);
    GVar2 = (*gl->getError)();
    glu::checkError(GVar2,"glAttachShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x372);
    (*gl->shaderSource)(*out_te_id,1,(GLchar **)so_ids,(GLint *)0x0);
    GVar2 = (*gl->getError)();
    glu::checkError(GVar2,"glShaderSource() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x375);
  }
  if (out_gs_id != (GLuint *)0x0) {
    so_ids._0_8_ = (local_40->_M_dataplus)._M_p;
    GVar1 = (*gl->createShader)(0x8dd9);
    *out_gs_id = GVar1;
    GVar2 = (*gl->getError)();
    glu::checkError(GVar2,"glCreateShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x37d);
    (*gl->attachShader)(*out_po_id,*out_gs_id);
    GVar2 = (*gl->getError)();
    glu::checkError(GVar2,"glAttachShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x380);
    (*gl->shaderSource)(*out_gs_id,1,(GLchar **)so_ids,(GLint *)0x0);
    GVar2 = (*gl->getError)();
    glu::checkError(GVar2,"glShaderSource() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,899);
  }
  if (out_fs_id != (GLuint *)0x0) {
    so_ids._0_8_ = (local_38->_M_dataplus)._M_p;
    GVar1 = (*gl->createShader)(0x8b30);
    *out_fs_id = GVar1;
    GVar2 = (*gl->getError)();
    glu::checkError(GVar2,"glCreateShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x38b);
    (*gl->attachShader)(*out_po_id,*out_fs_id);
    GVar2 = (*gl->getError)();
    glu::checkError(GVar2,"glAttachShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x38e);
    (*gl->shaderSource)(*out_fs_id,1,(GLchar **)so_ids,(GLint *)0x0);
    GVar2 = (*gl->getError)();
    glu::checkError(GVar2,"glShaderSource() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x391);
  }
  so_ids[1] = 0;
  so_ids[0] = 0;
  if (out_vs_id != (GLuint *)0x0) {
    so_ids[0] = *out_vs_id;
  }
  if (out_tc_id != (GLuint *)0x0) {
    so_ids[1] = *out_tc_id;
  }
  so_ids[3] = 0;
  so_ids[2] = 0;
  if (out_te_id != (GLuint *)0x0) {
    so_ids[2] = *out_te_id;
  }
  if (out_gs_id != (GLuint *)0x0) {
    so_ids[3] = *out_gs_id;
  }
  if (out_fs_id == (GLuint *)0x0) {
    so_ids[4] = 0;
  }
  else {
    so_ids[4] = *out_fs_id;
  }
  lVar3 = 0;
  do {
    if (lVar3 == 5) {
      if (xfb_varyings != (GLchar **)0x0) {
        (*gl->transformFeedbackVaryings)(*out_po_id,*n_xfb_varyings,xfb_varyings,0x8c8c);
        GVar2 = (*gl->getError)();
        glu::checkError(GVar2,"glTransformFeedbackVaryings() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                        ,0x3b3);
      }
      (*gl->linkProgram)(*out_po_id);
      GVar2 = (*gl->getError)();
      glu::checkError(GVar2,"glLinkProgram() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x3b7);
      (*gl->getProgramiv)(*out_po_id,0x8b82,&link_status);
      GVar2 = (*gl->getError)();
      glu::checkError(GVar2,"glGetProgramiv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x3ba);
      return link_status == 1;
    }
    GVar1 = so_ids[lVar3];
    if (GVar1 != 0) {
      compile_status = 0;
      (*gl->compileShader)(GVar1);
      GVar2 = (*gl->getError)();
      glu::checkError(GVar2,"glCompileShader() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x3a3);
      (*gl->getShaderiv)(GVar1,0x8b81,&compile_status);
      GVar2 = (*gl->getError)();
      glu::checkError(GVar2,"glGetShaderiv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x3a6);
      if (compile_status != 1) {
        return false;
      }
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

bool Utils::buildProgram(const glw::Functions& gl, const std::string& vs_body, const std::string& tc_body,
						 const std::string& te_body, const std::string& gs_body, const std::string& fs_body,
						 const glw::GLchar** xfb_varyings, const unsigned int& n_xfb_varyings, glw::GLuint* out_vs_id,
						 glw::GLuint* out_tc_id, glw::GLuint* out_te_id, glw::GLuint* out_gs_id, glw::GLuint* out_fs_id,
						 glw::GLuint* out_po_id)
{
	bool result = false;

	/* Link the program object */
	glw::GLint link_status = GL_FALSE;

	/* Create objects, set up shader bodies and attach all requested shaders to the program object */
	*out_po_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed.");

	if (out_vs_id != DE_NULL)
	{
		const char* vs_body_raw_ptr = vs_body.c_str();

		*out_vs_id = gl.createShader(GL_VERTEX_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed.");

		gl.attachShader(*out_po_id, *out_vs_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call failed.");

		gl.shaderSource(*out_vs_id, 1 /* count */, &vs_body_raw_ptr, DE_NULL /* length */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed.");
	}

	if (out_tc_id != DE_NULL)
	{
		const char* tc_body_raw_ptr = tc_body.c_str();

		*out_tc_id = gl.createShader(GL_TESS_CONTROL_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed.");

		gl.attachShader(*out_po_id, *out_tc_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call failed.");

		gl.shaderSource(*out_tc_id, 1 /* count */, &tc_body_raw_ptr, DE_NULL /* length */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed.");
	}

	if (out_te_id != DE_NULL)
	{
		const char* te_body_raw_ptr = te_body.c_str();

		*out_te_id = gl.createShader(GL_TESS_EVALUATION_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed.");

		gl.attachShader(*out_po_id, *out_te_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call failed.");

		gl.shaderSource(*out_te_id, 1 /* count */, &te_body_raw_ptr, DE_NULL /* length */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed.");
	}

	if (out_gs_id != DE_NULL)
	{
		const char* gs_body_raw_ptr = gs_body.c_str();

		*out_gs_id = gl.createShader(GL_GEOMETRY_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed.");

		gl.attachShader(*out_po_id, *out_gs_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call failed.");

		gl.shaderSource(*out_gs_id, 1 /* count */, &gs_body_raw_ptr, DE_NULL /* length */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed.");
	}

	if (out_fs_id != DE_NULL)
	{
		const char* fs_body_raw_ptr = fs_body.c_str();

		*out_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed.");

		gl.attachShader(*out_po_id, *out_fs_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call failed.");

		gl.shaderSource(*out_fs_id, 1 /* count */, &fs_body_raw_ptr, DE_NULL /* length */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed.");
	}

	/* Compile all shaders */
	const glw::GLuint so_ids[] = { (out_vs_id != DE_NULL) ? *out_vs_id : 0, (out_tc_id != DE_NULL) ? *out_tc_id : 0,
								   (out_te_id != DE_NULL) ? *out_te_id : 0, (out_gs_id != DE_NULL) ? *out_gs_id : 0,
								   (out_fs_id != DE_NULL) ? *out_fs_id : 0 };
	const unsigned int n_so_ids = sizeof(so_ids) / sizeof(so_ids[0]);

	for (unsigned int n_so_id = 0; n_so_id < n_so_ids; ++n_so_id)
	{
		glw::GLuint so_id = so_ids[n_so_id];

		if (so_id != 0)
		{
			glw::GLint compile_status = GL_FALSE;

			gl.compileShader(so_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed.");

			gl.getShaderiv(so_id, GL_COMPILE_STATUS, &compile_status);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

			if (compile_status != GL_TRUE)
			{
				goto end;
			}
		} /* if (so_id != 0) */
	}	 /* for (all shader objects) */

	/* Set up XFB */
	if (xfb_varyings != NULL)
	{
		gl.transformFeedbackVaryings(*out_po_id, n_xfb_varyings, xfb_varyings, GL_INTERLEAVED_ATTRIBS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() call failed.");
	}

	gl.linkProgram(*out_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed.");

	gl.getProgramiv(*out_po_id, GL_LINK_STATUS, &link_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

	if (link_status != GL_TRUE)
	{
		goto end;
	}

	/* All done */
	result = true;

end:
	return result;
}